

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTest.cxx
# Opt level: O2

tm * __thiscall cmCTest::GetNightlyTime(cmCTest *this,string *str,bool tomorrowtag)

{
  tm *ptVar1;
  ostream *poVar2;
  long lVar3;
  undefined7 in_register_00000011;
  char *local_5e8 [4];
  time_t tctime;
  time_t ntime;
  undefined4 local_5b4;
  ostringstream cmCTestLog_msg;
  char buf [1024];
  
  tctime = time((time_t *)0x0);
  ptVar1 = gmtime(&tctime);
  snprintf(buf,0x400,"%d%02d%02d %s",(ulong)(ptVar1->tm_year + 0x76c),(ulong)(ptVar1->tm_mon + 1),
           (ulong)(uint)ptVar1->tm_mday,(str->_M_dataplus)._M_p);
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&cmCTestLog_msg);
  poVar2 = std::operator<<((ostream *)&cmCTestLog_msg,"Determine Nightly Start Time");
  poVar2 = std::endl<char,std::char_traits<char>>(poVar2);
  poVar2 = std::operator<<(poVar2,"   Specified time: ");
  poVar2 = std::operator<<(poVar2,(string *)str);
  std::endl<char,std::char_traits<char>>(poVar2);
  std::__cxx11::stringbuf::str();
  Log(this,1,
      "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/cmCTest.cxx",
      0xeb,local_5e8[0],false);
  std::__cxx11::string::~string((string *)local_5e8);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&cmCTestLog_msg);
  lVar3 = curl_getdate(buf,&tctime);
  ntime = lVar3;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&cmCTestLog_msg);
  poVar2 = std::operator<<((ostream *)&cmCTestLog_msg,"   Get curl time: ");
  poVar2 = std::ostream::_M_insert<long>((long)poVar2);
  std::endl<char,std::char_traits<char>>(poVar2);
  std::__cxx11::stringbuf::str();
  Log(this,0,
      "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/cmCTest.cxx",
      0xf3,local_5e8[0],false);
  std::__cxx11::string::~string((string *)local_5e8);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&cmCTestLog_msg);
  tctime = time((time_t *)0x0);
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&cmCTestLog_msg);
  poVar2 = std::operator<<((ostream *)&cmCTestLog_msg,"   Get the current time: ");
  poVar2 = std::ostream::_M_insert<long>((long)poVar2);
  std::endl<char,std::char_traits<char>>(poVar2);
  std::__cxx11::stringbuf::str();
  Log(this,0,
      "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/cmCTest.cxx",
      0xf5,local_5e8[0],false);
  std::__cxx11::string::~string((string *)local_5e8);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&cmCTestLog_msg);
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&cmCTestLog_msg);
  poVar2 = std::operator<<((ostream *)&cmCTestLog_msg,"Seconds: ");
  poVar2 = std::ostream::_M_insert<long>((long)poVar2);
  std::endl<char,std::char_traits<char>>(poVar2);
  std::__cxx11::stringbuf::str();
  local_5b4 = (undefined4)CONCAT71(in_register_00000011,tomorrowtag);
  Log(this,0,
      "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/cmCTest.cxx",
      0xf8,local_5e8[0],false);
  std::__cxx11::string::~string((string *)local_5e8);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&cmCTestLog_msg);
  while (tctime < lVar3) {
    lVar3 = lVar3 + -0x15180;
    ntime = lVar3;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&cmCTestLog_msg);
    poVar2 = std::operator<<((ostream *)&cmCTestLog_msg,"Pick yesterday");
    std::endl<char,std::char_traits<char>>(poVar2);
    std::__cxx11::stringbuf::str();
    Log(this,0,
        "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/cmCTest.cxx"
        ,0x100,local_5e8[0],false);
    std::__cxx11::string::~string((string *)local_5e8);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&cmCTestLog_msg);
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&cmCTestLog_msg);
    poVar2 = std::operator<<((ostream *)&cmCTestLog_msg,"   Future time, subtract day: ");
    poVar2 = std::ostream::_M_insert<long>((long)poVar2);
    std::endl<char,std::char_traits<char>>(poVar2);
    std::__cxx11::stringbuf::str();
    Log(this,0,
        "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/cmCTest.cxx"
        ,0x102,local_5e8[0],false);
    std::__cxx11::string::~string((string *)local_5e8);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&cmCTestLog_msg);
  }
  while (lVar3 = lVar3 + 0x15180, lVar3 < tctime) {
    ntime = lVar3;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&cmCTestLog_msg);
    poVar2 = std::operator<<((ostream *)&cmCTestLog_msg,"   Past time, add day: ");
    poVar2 = std::ostream::_M_insert<long>((long)poVar2);
    std::endl<char,std::char_traits<char>>(poVar2);
    std::__cxx11::stringbuf::str();
    Log(this,0,
        "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/cmCTest.cxx"
        ,0x106,local_5e8[0],false);
    std::__cxx11::string::~string((string *)local_5e8);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&cmCTestLog_msg);
  }
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&cmCTestLog_msg);
  poVar2 = std::operator<<((ostream *)&cmCTestLog_msg,"nightlySeconds: ");
  poVar2 = std::ostream::_M_insert<long>((long)poVar2);
  std::endl<char,std::char_traits<char>>(poVar2);
  std::__cxx11::stringbuf::str();
  Log(this,0,
      "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/cmCTest.cxx",
      0x108,local_5e8[0],false);
  std::__cxx11::string::~string((string *)local_5e8);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&cmCTestLog_msg);
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&cmCTestLog_msg);
  poVar2 = std::operator<<((ostream *)&cmCTestLog_msg,"   Current time: ");
  poVar2 = std::ostream::_M_insert<long>((long)poVar2);
  poVar2 = std::operator<<(poVar2," Nightly time: ");
  poVar2 = std::ostream::_M_insert<long>((long)poVar2);
  std::endl<char,std::char_traits<char>>(poVar2);
  std::__cxx11::stringbuf::str();
  Log(this,0,
      "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/cmCTest.cxx",
      0x10b,local_5e8[0],false);
  std::__cxx11::string::~string((string *)local_5e8);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&cmCTestLog_msg);
  if ((char)local_5b4 != '\0') {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&cmCTestLog_msg);
    poVar2 = std::operator<<((ostream *)&cmCTestLog_msg,"   Use future tag, Add a day");
    std::endl<char,std::char_traits<char>>(poVar2);
    std::__cxx11::stringbuf::str();
    Log(this,1,
        "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/cmCTest.cxx"
        ,0x10d,local_5e8[0],false);
    std::__cxx11::string::~string((string *)local_5e8);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&cmCTestLog_msg);
    ntime = lVar3;
  }
  ptVar1 = gmtime(&ntime);
  return (tm *)ptVar1;
}

Assistant:

struct tm* cmCTest::GetNightlyTime(std::string const& str, bool tomorrowtag)
{
  struct tm* lctime;
  time_t tctime = time(nullptr);
  lctime = gmtime(&tctime);
  char buf[1024];
  // add todays year day and month to the time in str because
  // curl_getdate no longer assumes the day is today
  snprintf(buf, sizeof(buf), "%d%02d%02d %s", lctime->tm_year + 1900,
           lctime->tm_mon + 1, lctime->tm_mday, str.c_str());
  cmCTestLog(this, OUTPUT,
             "Determine Nightly Start Time" << std::endl
                                            << "   Specified time: " << str
                                            << std::endl);
  // Convert the nightly start time to seconds. Since we are
  // providing only a time and a timezone, the current date of
  // the local machine is assumed. Consequently, nightlySeconds
  // is the time at which the nightly dashboard was opened or
  // will be opened on the date of the current client machine.
  // As such, this time may be in the past or in the future.
  time_t ntime = curl_getdate(buf, &tctime);
  cmCTestLog(this, DEBUG, "   Get curl time: " << ntime << std::endl);
  tctime = time(nullptr);
  cmCTestLog(this, DEBUG, "   Get the current time: " << tctime << std::endl);

  const int dayLength = 24 * 60 * 60;
  cmCTestLog(this, DEBUG, "Seconds: " << tctime << std::endl);
  while (ntime > tctime) {
    // If nightlySeconds is in the past, this is the current
    // open dashboard, then return nightlySeconds.  If
    // nightlySeconds is in the future, this is the next
    // dashboard to be opened, so subtract 24 hours to get the
    // time of the current open dashboard
    ntime -= dayLength;
    cmCTestLog(this, DEBUG, "Pick yesterday" << std::endl);
    cmCTestLog(this, DEBUG,
               "   Future time, subtract day: " << ntime << std::endl);
  }
  while (tctime > (ntime + dayLength)) {
    ntime += dayLength;
    cmCTestLog(this, DEBUG, "   Past time, add day: " << ntime << std::endl);
  }
  cmCTestLog(this, DEBUG, "nightlySeconds: " << ntime << std::endl);
  cmCTestLog(this, DEBUG,
             "   Current time: " << tctime << " Nightly time: " << ntime
                                 << std::endl);
  if (tomorrowtag) {
    cmCTestLog(this, OUTPUT, "   Use future tag, Add a day" << std::endl);
    ntime += dayLength;
  }
  lctime = gmtime(&ntime);
  return lctime;
}